

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O2

int lj_cf_buffer_method_skip(lua_State *L)

{
  uint uVar1;
  SBufExt *pSVar2;
  char *pcVar3;
  
  pSVar2 = buffer_tobuf(L);
  uVar1 = lj_lib_checkintrange(L,2,0,0x7fffff00);
  if (uVar1 < (uint)(*(int *)&pSVar2->w - (int)pSVar2->r)) {
    pcVar3 = pSVar2->r + uVar1;
  }
  else {
    pcVar3 = pSVar2->b;
    pSVar2->w = pcVar3;
  }
  pSVar2->r = pcVar3;
  L->top = L->base + 1;
  return 1;
}

Assistant:

LJLIB_CF(buffer_method_skip)		LJLIB_REC(.)
{
  SBufExt *sbx = buffer_tobuf(L);
  MSize n = (MSize)lj_lib_checkintrange(L, 2, 0, LJ_MAX_BUF);
  MSize len = sbufxlen(sbx);
  if (n < len) {
    sbx->r += n;
  } else {
    sbx->r = sbx->w = sbx->b;
  }
  L->top = L->base+1;  /* Chain buffer object. */
  return 1;
}